

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::internal::SooRep::set_non_soo
          (SooRep *this,bool was_soo,int capacity,void *elements)

{
  Nonnull<const_char_*> failure_msg;
  int line;
  bool local_31;
  void *local_30;
  LogMessageFatal local_28;
  unsigned_long local_18;
  
  local_28.super_LogMessage.errno_saver_.saved_errno_._0_1_ =
       (undefined1  [16])((undefined1  [16])this->field_0 & (undefined1  [16])0x4) ==
       (undefined1  [16])0x0;
  local_31 = was_soo;
  local_30 = elements;
  failure_msg = absl::lts_20250127::log_internal::Check_EQImpl<bool,bool>
                          (&local_31,(bool *)&local_28,"was_soo == is_soo()");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    local_28.super_LogMessage._0_8_ = 0;
    failure_msg = absl::lts_20250127::log_internal::Check_NEImpl<void*,decltype(nullptr)>
                            (&local_30,(void **)&local_28,"elements != nullptr");
    if (failure_msg == (Nullable<const_char_*>)0x0) {
      local_28.super_LogMessage._0_8_ = ZEXT48((uint)local_30 & 7);
      local_18 = 0;
      failure_msg = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_long,unsigned_long>
                              ((unsigned_long *)&local_28,&local_18,
                               "reinterpret_cast<uintptr_t>(elements) % kSooPtrAlignment == uintptr_t{0}"
                              );
      if (failure_msg == (Nullable<const_char_*>)0x0) {
        if (local_31 != false) {
          (this->field_0).long_rep.size = *(uint *)&this->field_0 & 3;
        }
        (this->field_0).long_rep.capacity = capacity;
        (this->field_0).long_rep.elements_int = (ulong)local_30 | 4;
        return;
      }
      line = 0xe0;
    }
    else {
      line = 0xde;
    }
  }
  else {
    line = 0xdd;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_28,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
             ,line,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_28);
}

Assistant:

void set_non_soo(bool was_soo, int capacity, void* elements) {
    ABSL_DCHECK_EQ(was_soo, is_soo());
    ABSL_DCHECK_NE(elements, nullptr);
    ABSL_DCHECK_EQ(reinterpret_cast<uintptr_t>(elements) % kSooPtrAlignment,
                   uintptr_t{0});
    if (was_soo) long_rep.size = short_rep.size();
    long_rep.capacity = capacity;
    long_rep.elements_int = reinterpret_cast<uintptr_t>(elements) | kNotSooBit;
  }